

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

jpc_ms_t * jpc_ms_create(int type)

{
  jpc_ms_t *pjVar1;
  jpc_mstabent_t *pjVar2;
  
  pjVar1 = (jpc_ms_t *)jas_malloc(0x88);
  if (pjVar1 != (jpc_ms_t *)0x0) {
    pjVar1->id = (long)type;
    pjVar1->len = 0;
    pjVar2 = jpc_mstab_lookup(type);
    pjVar1->ops = &pjVar2->ops;
    (pjVar1->parms).sot.tileno = 0;
    (pjVar1->parms).sot.len = 0;
    (pjVar1->parms).siz.height = 0;
    (pjVar1->parms).siz.xoff = 0;
    (pjVar1->parms).siz.yoff = 0;
    (pjVar1->parms).siz.tilewidth = 0;
    (pjVar1->parms).siz.tileheight = 0;
    (pjVar1->parms).siz.tilexoff = 0;
    (pjVar1->parms).siz.tileyoff = 0;
    (pjVar1->parms).siz.numcomps = 0;
    (pjVar1->parms).siz.comps = (jpc_sizcomp_t *)0x0;
    *(undefined8 *)((long)&pjVar1->parms + 0x58) = 0;
    *(undefined8 *)((long)&pjVar1->parms + 0x60) = 0;
  }
  return pjVar1;
}

Assistant:

jpc_ms_t *jpc_ms_create(int type)
{
	jpc_ms_t *ms;
	const jpc_mstabent_t *mstabent;

	if (!(ms = jas_malloc(sizeof(jpc_ms_t)))) {
		return 0;
	}
	ms->id = type;
	ms->len = 0;
	mstabent = jpc_mstab_lookup(ms->id);
	ms->ops = &mstabent->ops;
	memset(&ms->parms, 0, sizeof(jpc_msparms_t));
	return ms;
}